

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_tcp.c
# Opt level: O0

void throughput_tcp_main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  epoll_event *__events;
  int64_t iVar4;
  tcp_connection *ptVar5;
  request *prVar6;
  long lVar7;
  ssize_t sVar8;
  int *piVar9;
  long *in_FS_OFFSET;
  byte_req_pair bVar10;
  uint64_t local_140;
  char local_138 [8];
  char hostname_2 [64];
  char hostname_1 [64];
  char hostname [64];
  undefined1 local_70 [4];
  int start_iov;
  timespec tx_timestamp;
  byte_req_pair send_res;
  byte_req_pair read_res;
  request *to_send;
  tcp_connection *conn;
  epoll_event *events;
  long next_tx;
  int bytes_to_send;
  int ret;
  int conn_per_thread;
  int i;
  int idx;
  int ready;
  
  iVar1 = throughput_open_connections();
  if (iVar1 != 0) {
    return;
  }
  iVar1 = get_conn_count();
  iVar2 = get_thread_count();
  __events = (epoll_event *)malloc((long)(iVar1 / iVar2) * 0xc);
  pthread_barrier_wait((pthread_barrier_t *)&conn_open_barrier);
  set_conn_open(1);
  events = (epoll_event *)time_ns();
  do {
    while (iVar3 = should_load(), iVar3 == 0) {
      events = (epoll_event *)time_ns();
    }
    while ((iVar4 = time_ns(), (long)events <= iVar4 &&
           (ptVar5 = pick_conn(), ptVar5 != (tcp_connection *)0x0))) {
      prVar6 = prepare_request();
      next_tx._0_4_ = 0;
      hostname[0x3c] = '\0';
      hostname[0x3d] = '\0';
      hostname[0x3e] = '\0';
      hostname[0x3f] = '\0';
      for (ret = 0; ret < prVar6->iov_cnt; ret = ret + 1) {
        next_tx._0_4_ = (int)next_tx + (int)prVar6->iovs[ret].iov_len;
      }
      while( true ) {
        do {
          sVar8 = writev(ptVar5->fd,(iovec *)(prVar6->iovs + (int)hostname._60_4_),prVar6->iov_cnt);
          next_tx._4_4_ = (int)sVar8;
          if ((next_tx._4_4_ < 0) && (piVar9 = __errno_location(), *piVar9 != 0xb)) {
            gethostname(hostname_1 + 0x38,0x40);
            fprintf(_stderr,"[%s] ",hostname_1 + 0x38);
            perror("Unknown connection error write\n");
            return;
          }
        } while (next_tx._4_4_ < 0);
        if (next_tx._4_4_ == (int)next_tx) break;
        next_tx._0_4_ = (int)next_tx - next_tx._4_4_;
        ret._0_1_ = hostname[0x3c];
        ret._1_1_ = hostname[0x3d];
        ret._2_1_ = hostname[0x3e];
        ret._3_1_ = hostname[0x3f];
        for (; ret < hostname._60_4_ + prVar6->iov_cnt; ret = ret + 1) {
          if ((ulong)(long)next_tx._4_4_ < prVar6->iovs[ret].iov_len) {
            prVar6->iovs[ret].iov_len = prVar6->iovs[ret].iov_len - (long)next_tx._4_4_;
            prVar6->iovs[ret].iov_base =
                 (void *)((long)prVar6->iovs[ret].iov_base + (long)next_tx._4_4_);
            break;
          }
          next_tx._4_4_ = next_tx._4_4_ - (int)prVar6->iovs[ret].iov_len;
        }
        prVar6->iov_cnt = prVar6->iov_cnt - (ret - hostname._60_4_);
        hostname._60_4_ = ret;
      }
      ptVar5->pending_reqs = ptVar5->pending_reqs + 1;
      time_ns_to_ts((timespec *)local_70);
      add_tx_timestamp((timespec *)local_70);
      tx_timestamp.tv_nsec = (__syscall_slong_t)next_tx._4_4_;
      bVar10.reqs = 1;
      bVar10.bytes = tx_timestamp.tv_nsec;
      add_throughput_tx_sample(bVar10);
      lVar7 = get_ia();
      events = (epoll_event *)((long)&events->events + lVar7);
    }
    iVar3 = epoll_wait(*(int *)(*in_FS_OFFSET + -0x1f8),__events,iVar1 / iVar2,0);
    for (ret = 0; ret < iVar3; ret = ret + 1) {
      ptVar5 = (tcp_connection *)
               (*(long *)(*in_FS_OFFSET + -0x1f0) +
               (long)*(int *)(&__events->field_0x4 + (long)ret * 0xc) * 0x400c);
      if (((&__events->events)[(long)ret * 3] & 1) == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                      ,0x150,"void throughput_tcp_main(void)");
      }
      sVar8 = recv(ptVar5->fd,ptVar5->buffer + ptVar5->buffer_idx,
                   (long)(int)(0x4000 - (uint)ptVar5->buffer_idx),0);
      if (((int)sVar8 < 0) && (piVar9 = __errno_location(), *piVar9 != 0xb)) {
        gethostname(hostname_2 + 0x38,0x40);
        fprintf(_stderr,"[%s] ",hostname_2 + 0x38);
        perror("Unknown connection error read\n");
        return;
      }
      if ((int)sVar8 == 0) {
        close(ptVar5->fd);
        gethostname(local_138,0x40);
        fprintf(_stderr,"[%s] ",local_138);
        fprintf(_stderr,"Connection closed\n");
        ptVar5->closed = 1;
      }
      else {
        ptVar5->buffer_idx = ptVar5->buffer_idx + (short)sVar8;
        bVar10 = handle_response(ptVar5);
        local_140 = bVar10.reqs;
        if (local_140 != 0) {
          ptVar5->pending_reqs = ptVar5->pending_reqs - (short)bVar10.reqs;
          add_throughput_rx_sample(bVar10);
        }
      }
    }
  } while( true );
}

Assistant:

static void throughput_tcp_main(void)
{
	int ready, idx, i, conn_per_thread, ret, bytes_to_send;
	long next_tx;
	struct epoll_event *events;
	struct tcp_connection *conn;
	struct request *to_send;
	struct byte_req_pair read_res;
	struct byte_req_pair send_res;
	struct timespec tx_timestamp;
	int start_iov;

	if (throughput_open_connections())
		return;

	/*Initializations*/
	conn_per_thread = get_conn_count() / get_thread_count();
	events = malloc(conn_per_thread * sizeof(struct epoll_event));

	pthread_barrier_wait(&conn_open_barrier);
	set_conn_open(1);

	next_tx = time_ns();
	while (1) {
		if (!should_load()) {
			next_tx = time_ns();
			continue;
		}
		while (time_ns() >= next_tx) {
			conn = pick_conn();
			if (!conn)
				goto REP_PROC;
			to_send = prepare_request();
			bytes_to_send = 0;
			start_iov = 0;
			for (i = 0; i < to_send->iov_cnt; i++)
				bytes_to_send += to_send->iovs[i].iov_len;
			while (1) {
				ret = writev(conn->fd, &to_send->iovs[start_iov], to_send->iov_cnt);
				if ((ret < 0) && (errno != EWOULDBLOCK)) {
					lancet_perror("Unknown connection error write\n");
					return;
				}
				if (ret < 0)
					continue;
				if (ret == bytes_to_send)
					break;
				bytes_to_send -= ret;
				for (i = start_iov; i < start_iov + to_send->iov_cnt; i++) {
					if (ret < to_send->iovs[i].iov_len) {
						to_send->iovs[i].iov_len -= ret;
						to_send->iovs[i].iov_base += ret;
						break;
					}
					ret -= to_send->iovs[i].iov_len;
				}
				to_send->iov_cnt -= i - start_iov;
				start_iov = i;
			}
			conn->pending_reqs++;
			time_ns_to_ts(&tx_timestamp);
			add_tx_timestamp(&tx_timestamp);

			/*BookKeeping*/
			send_res.bytes = ret;
			send_res.reqs = 1;
			add_throughput_tx_sample(send_res);

			/*Schedule next*/
			next_tx += get_ia();
		}
	REP_PROC:
		/* process responses */
		ready = epoll_wait(epoll_fd, events, conn_per_thread, 0);
		for (i = 0; i < ready; i++) {
			idx = events[i].data.u32;
			conn = &connections[idx];
			/* Handle incoming packet */
			if (events[i].events & EPOLLIN) {
				// read into the connection buffer
				ret = recv(conn->fd, &conn->buffer[conn->buffer_idx],
						   MAX_PAYLOAD - conn->buffer_idx, 0);
				if ((ret < 0) && (errno != EWOULDBLOCK)) {
					lancet_perror("Unknown connection error read\n");
					return;
				}
				if (ret == 0) {
					close(conn->fd);
					lancet_fprintf(stderr, "Connection closed\n");
					conn->closed = 1;
					continue;
				}
				conn->buffer_idx += ret;

				read_res = handle_response(conn);
				if (read_res.reqs > 0) {
					conn->pending_reqs -= read_res.reqs;
					/* Bookkeeping */
					add_throughput_rx_sample(read_res);
				}
			} else
				assert(0);
		}
	}
}